

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void declare_natives(Vm *vm)

{
  Vm *vm_local;
  
  make_native(vm,"println",7,std_println,'\x01',false);
  make_native(vm,"input",5,std_input,'\0',true);
  make_native(vm,"print",5,std_print,'\x01',false);
  make_native(vm,"split",5,std_split,'\x02',true);
  make_native(vm,"append",6,std_list_append,'\x02',true);
  make_native(vm,"list",4,std_list,'\x01',true);
  make_native(vm,"exit",4,std_exit,'\x01',true);
  make_native(vm,"num",3,std_num,'\x01',true);
  make_native(vm,"str",3,std_str,'\x01',true);
  make_native(vm,"len",3,std_len,'\x01',true);
  return;
}

Assistant:

void declare_natives(Vm *vm) {
    make_native(vm, "println", 7, std_println, 1, false);
    make_native(vm, "input", 5, std_input, 0, true);
    make_native(vm, "print", 5, std_print, 1, false);
    make_native(vm, "split", 5, std_split, 2, true);
    make_native(vm, "append", 6, std_list_append, 2, true);
    make_native(vm, "list", 4, std_list, 1, true);
    make_native(vm, "exit", 4, std_exit, 1, true);
    make_native(vm, "num", 3, std_num, 1, true);
    make_native(vm, "str", 3, std_str, 1, true);
    make_native(vm, "len", 3, std_len, 1, true);
}